

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O1

_Bool x86_cpu_tlb_fill_x86_64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  TranslationBlock *pTVar5;
  ulong uVar6;
  TranslationBlock *pTVar7;
  hwaddr hVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  undefined7 in_register_00000089;
  TranslationBlock *unaff_R12;
  TranslationBlock *unaff_R13;
  vaddr unaff_R15;
  bool bVar14;
  uint local_6c;
  TranslationBlock *local_68;
  TranslationBlock *local_60;
  ulong local_58;
  MMUAccessType local_4c;
  TranslationBlock *local_48;
  int local_40;
  undefined4 local_3c;
  ulong local_38;
  
  cs[1].tb_jmp_cache[0x39e] = (TranslationBlock *)retaddr;
  uVar10 = *(uint *)(cs[1].tb_jmp_cache + 0x101);
  uVar11 = 0xffffffffffffffff;
  if ((uVar10 >> 0x13 & 1) == 0) {
    uVar11 = (ulong)*(int *)(cs[1].tb_jmp_cache + 0x125);
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x903) & 0x80) == 0) {
    pTVar5 = (TranslationBlock *)(addr & 0xffffffff);
    if ((uVar10 >> 0xe & 1) != 0) {
      pTVar5 = (TranslationBlock *)addr;
    }
    local_6c = 7;
    iVar13 = 0x1000;
    goto LAB_0050e8e4;
  }
  local_3c = (undefined4)CONCAT71(in_register_00000089,probe);
  local_4c = access_type & MMU_DATA_STORE;
  uVar12 = ((ulong)(*(byte *)((long)cs[1].tb_jmp_cache + 0x989) >> 3) << 0x3f) + 0x800fff0000000000;
  iVar13 = mmu_idx;
  local_60 = (TranslationBlock *)addr;
  if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    local_48 = (TranslationBlock *)0x0;
    local_58 = uVar12;
    pTVar5 = (TranslationBlock *)
             get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                          (addr >> 0x16 & 0x3ff) * 4 & uVar11,MMU_DATA_STORE,(int *)0x0);
    uVar2 = x86_ldl_phys_x86_64(cs,(hwaddr)pTVar5);
    iVar9 = 3;
    uVar12 = local_58;
    pTVar7 = pTVar5;
    if ((uVar2 & 1) != 0) {
      uVar6 = (ulong)uVar2;
      addr = uVar6 | 0x8000000000000000;
      if (((char)uVar2 < '\0') && (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) != 0)) {
        iVar9 = 6;
        iVar13 = 0x400000;
        uVar12 = 0x200000;
        pTVar7 = (TranslationBlock *)((ulong)(uVar2 & 0x1fe000) << 0x13 | uVar6);
        local_68 = pTVar5;
      }
      else {
        local_38 = uVar6;
        if ((uVar2 & 0x20) == 0) {
          uVar2 = uVar2 | 0x20;
          x86_stl_phys_notdirty_x86_64(cs,(hwaddr)pTVar5,uVar2);
        }
        local_68 = (TranslationBlock *)
                   get_hphys(cs,(ulong)((uint)uVar11 &
                                       ((uint)((ulong)local_60 >> 10) & 0xffc | uVar2 & 0xfffff000))
                             ,MMU_DATA_STORE,(int *)0x0);
        uVar2 = x86_ldl_phys_x86_64(cs,(hwaddr)local_68);
        pTVar7 = (TranslationBlock *)(ulong)uVar2;
        if ((uVar2 & 1) == 0) {
          iVar9 = 3;
          uVar12 = local_58;
        }
        else {
          addr = (ulong)((uint)local_38 & uVar2) | 0x8000000000000000;
          iVar13 = 0x1000;
          iVar9 = 0;
          uVar12 = 0;
        }
      }
    }
    if (iVar9 == 0) {
switchD_0050e74c_caseD_0:
      uVar12 = uVar12 | (long)(iVar13 + -1) & 0xfffffffffe000U;
    }
    else if (iVar9 != 6) goto LAB_0050eb14;
    if (((ulong)pTVar7 & uVar12) == 0) {
      if ((mmu_idx == 1) && ((addr & 4) == 0)) {
        uVar10 = 0;
      }
      else {
        local_6c = 0;
        if (((mmu_idx != 0) || ((addr & 4) == 0)) &&
           ((local_6c = 1, (addr & 2) != 0 ||
            ((mmu_idx != 1 && ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) == 0)))))) {
          local_6c = 3;
        }
        if (((long)addr < 0) &&
           (((mmu_idx == 1 || ((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x10) == 0)) ||
            ((addr & 4) == 0)))) {
          local_6c = local_6c | 4;
        }
        uVar10 = 0;
        if ((((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x40) != 0) &&
            ((*(byte *)((long)cs[1].tb_jmp_cache + 0x809) & 0x40) != 0)) &&
           ((uVar10 = 0, (addr & 4) != 0 &&
            (uVar4 = *(uint *)(cs[1].tb_jmp_cache + 0x37e), uVar4 != 0)))) {
          uVar3 = 4;
          if ((((uVar4 >> ((uint)((ulong)pTVar7 >> 0x3a) & 0x1e) & 1) == 0) &&
              (uVar3 = 7, (uVar4 >> ((byte)((ulong)pTVar7 >> 0x3a) & 0x1e) & 2) != 0)) &&
             ((mmu_idx == 1 || ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) != 0)))) {
            uVar3 = 5;
          }
          local_6c = local_6c & uVar3;
          uVar10 = 0;
          iVar9 = 0;
          if ((uVar3 >> (access_type & 0x1f) & 1) == 0) {
            if (access_type == MMU_INST_FETCH) {
              __assert_fail("is_write1 != 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                            ,0x25c,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
            }
            iVar9 = 7;
            uVar10 = 0x20;
          }
          if (iVar9 != 0) {
            if (iVar9 != 7) goto switchD_0050e74c_caseD_1;
            goto LAB_0050eb0c;
          }
        }
        if ((local_6c >> (access_type & 0x1f) & 1) != 0) {
          bVar1 = ((ulong)pTVar7 & 0x40) == 0 & (undefined1)local_4c;
          pTVar5 = pTVar7;
          if (((byte)(((ulong)pTVar7 & 0xffffffff) >> 5) & 7 & (bVar1 ^ 1)) == 0) {
            uVar12 = (ulong)bVar1 << 6;
            pTVar5 = (TranslationBlock *)(uVar12 | (ulong)pTVar7 | 0x20);
            x86_stl_phys_notdirty_x86_64(cs,(hwaddr)local_68,(uint)uVar12 | (uint)pTVar7 | 0x20);
          }
          addr = (vaddr)local_60;
          if (((ulong)pTVar5 & 0x40) == 0) {
            if (local_4c != MMU_DATA_LOAD) {
              __assert_fail("!is_write",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                            ,0x273,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
            }
            local_6c = local_6c & 0xfffffffd;
          }
LAB_0050e8e4:
          hVar8 = get_hphys(cs,(ulong)((uint)addr & iVar13 - 1U) +
                               (uVar11 & 0xffffffffff000 & (long)-iVar13 & (ulong)pTVar5),
                            access_type,(int *)&local_6c);
          if ((local_6c >> (access_type & 0x1f) & 1) != 0) {
            tlb_set_page_with_attrs_x86_64
                      (cs,addr & 0xfffffffffffff000,hVar8 & 0xfffffffffffff000,
                       (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2),local_6c,
                       mmu_idx,(long)iVar13);
            return true;
          }
          __assert_fail("prot & (1 << is_write1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                        ,0x284,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
        }
      }
    }
    else {
switchD_0050e74c_caseD_4:
      uVar10 = 8;
    }
LAB_0050eb0c:
    local_48 = (TranslationBlock *)(ulong)(uVar10 | 1);
  }
  else {
    local_40 = mmu_idx;
    if ((uVar10 >> 0xe & 1) == 0) {
      hVar8 = get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                           (addr >> 0x1e & 3) * 8 & uVar11,MMU_DATA_STORE,(int *)0x0);
      unaff_R12 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,hVar8);
      pTVar7 = unaff_R13;
      if (((ulong)unaff_R12 & 1) == 0) {
        iVar9 = 3;
      }
      else {
        uVar12 = uVar12 | 0x7ff0000000000000;
        if ((ulong)unaff_R12 >> 0x28 == 0) {
          addr = 0x8000000000000006;
          pTVar7 = (TranslationBlock *)0x0;
          goto LAB_0050e5ca;
        }
        iVar9 = 4;
      }
    }
    else {
      uVar10 = (uint)cs[1].tb_jmp_cache[0x124];
      bVar14 = (uVar10 >> 0xc & 1) != 0;
      pTVar7 = (TranslationBlock *)(ulong)bVar14;
      if (((long)addr >> (bVar14 * '\t' + 0x2fU & 0x3f)) - 1U < 0xfffffffffffffffe) {
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x388) = 0;
        cs->exception_index = 0xd;
        iVar9 = 1;
        bVar14 = false;
      }
      else {
        unaff_R15 = 0x8000000000000000;
        pTVar5 = cs[1].tb_jmp_cache[0x123];
        if ((uVar10 >> 0xc & 1) == 0) {
          local_68 = (TranslationBlock *)0x8000000000000000;
          unaff_R15 = 0x8000000000000006;
LAB_0050e43a:
          unaff_R13 = (TranslationBlock *)
                      get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x24) & 0xff8) |
                                   (ulong)pTVar5 & 0xffffffffff000) & uVar11,MMU_DATA_STORE,
                                (int *)0x0);
          pTVar7 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,(hwaddr)unaff_R13);
          if (((ulong)pTVar7 & 1) != 0) {
            unaff_R12 = pTVar7;
            if (((ulong)pTVar7 & (uVar12 | 0x80)) != 0) goto LAB_0050e5a2;
            pTVar5 = pTVar7;
            if (((ulong)pTVar7 & 0x20) == 0) {
              pTVar5 = (TranslationBlock *)((ulong)pTVar7 | 0x20);
              x86_stl_phys_notdirty_x86_64(cs,(hwaddr)unaff_R13,(uint)pTVar7 | 0x20);
            }
            unaff_R15 = unaff_R15 & ((ulong)pTVar5 ^ 0x8000000000000000);
            unaff_R13 = (TranslationBlock *)
                        get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x1b) & 0xff8) |
                                     (ulong)pTVar5 & 0xffffffffff000) & uVar11,MMU_DATA_STORE,
                                  (int *)0x0);
            pTVar7 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,(hwaddr)unaff_R13);
            if (((ulong)pTVar7 & 1) != 0) {
              if (((ulong)pTVar7 & uVar12) == 0) {
                local_68 = (TranslationBlock *)((ulong)local_68 ^ (ulong)pTVar7);
                if (((ulong)pTVar7 & 0x20) == 0) {
                  x86_stl_phys_notdirty_x86_64(cs,(hwaddr)unaff_R13,(uint)pTVar7 | 0x20);
                  pTVar7 = (TranslationBlock *)((ulong)pTVar7 | 0x20);
                }
                bVar14 = ((ulong)pTVar7 & 0x80) == 0;
                iVar9 = (((uint)pTVar7 & 0x80) >> 7) * 5;
                unaff_R12 = pTVar7;
                unaff_R15 = unaff_R15 & (ulong)local_68;
              }
              else {
                bVar14 = false;
                iVar9 = 4;
                unaff_R12 = pTVar7;
              }
              goto LAB_0050e5ac;
            }
          }
        }
        else {
          unaff_R13 = (TranslationBlock *)
                      get_hphys(cs,((ulong)((uint)(addr >> 0x2d) & 0xff8) |
                                   (ulong)pTVar5 & 0xfffffffffffff000) & uVar11,MMU_DATA_STORE,
                                (int *)0x0);
          pTVar7 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,(hwaddr)unaff_R13);
          if (((ulong)pTVar7 & 1) != 0) {
            unaff_R12 = pTVar7;
            if (((ulong)pTVar7 & (uVar12 | 0x80)) == 0) {
              local_68 = (TranslationBlock *)0x8000000000000000;
              pTVar5 = pTVar7;
              if (((ulong)pTVar7 & 0x20) == 0) {
                pTVar5 = (TranslationBlock *)((ulong)pTVar7 | 0x20);
                x86_stl_phys_notdirty_x86_64(cs,(hwaddr)unaff_R13,(uint)pTVar7 | 0x20);
              }
              unaff_R15 = (ulong)pTVar5 ^ 0x8000000000000000;
              goto LAB_0050e43a;
            }
LAB_0050e5a2:
            bVar14 = false;
            iVar9 = 4;
            pTVar7 = (TranslationBlock *)(uVar12 | 0x80);
            goto LAB_0050e5ac;
          }
        }
        iVar9 = 3;
        bVar14 = false;
        unaff_R12 = pTVar7;
      }
LAB_0050e5ac:
      addr = unaff_R15;
      iVar13 = 0x40000000;
      local_68 = unaff_R13;
      local_48 = unaff_R13;
      if (bVar14) {
LAB_0050e5ca:
        local_58 = uVar12;
        local_68 = (TranslationBlock *)
                   get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x12) & 0xff8) |
                                (ulong)unaff_R12 & 0xffffffffff000) & uVar11,MMU_DATA_STORE,
                             (int *)0x0);
        pTVar5 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,(hwaddr)local_68);
        iVar9 = 3;
        iVar13 = 0x40000000;
        uVar12 = local_58;
        if (((ulong)pTVar5 & 1) == 0) {
          local_68 = local_48;
          iVar13 = 0x40000000;
        }
        else if (((ulong)pTVar5 & local_58) == 0) {
          addr = ((ulong)pTVar5 ^ 0x8000000000000000) & addr;
          if ((char)pTVar5 < '\0') {
            iVar9 = 5;
            iVar13 = 0x200000;
            pTVar7 = pTVar5;
          }
          else {
            if (((ulong)pTVar5 & 0x20) == 0) {
              x86_stl_phys_notdirty_x86_64(cs,(hwaddr)local_68,(uint)pTVar5 | 0x20);
            }
            local_68 = (TranslationBlock *)
                       get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 9) & 0xff8) |
                                    (ulong)pTVar5 & 0xffffffffff000) & uVar11,MMU_DATA_STORE,
                                 (int *)0x0);
            pTVar7 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,(hwaddr)local_68);
            uVar12 = local_58;
            if (((ulong)pTVar7 & 1) == 0) {
              iVar13 = 0x40000000;
              iVar9 = 3;
            }
            else {
              iVar13 = 0x40000000;
              if (((ulong)pTVar7 & local_58) == 0) {
                addr = addr & ((ulong)pTVar7 ^ 0x8000000000000000);
                iVar9 = 0;
                iVar13 = 0x1000;
              }
              else {
                iVar9 = 4;
              }
            }
          }
        }
        else {
          local_68 = local_48;
          iVar9 = 4;
        }
      }
    }
    mmu_idx = local_40;
    switch(iVar9) {
    case 0:
    case 5:
      goto switchD_0050e74c_caseD_0;
    default:
      goto switchD_0050e74c_caseD_1;
    case 3:
      local_48 = (TranslationBlock *)0x0;
      break;
    case 4:
      goto switchD_0050e74c_caseD_4;
    }
  }
LAB_0050eb14:
  uVar4 = local_4c * 2 | (uint)local_48;
  uVar10 = uVar4 | 4;
  if (mmu_idx != 1) {
    uVar10 = uVar4;
  }
  if ((access_type == MMU_INST_FETCH) &&
     ((((*(byte *)((long)cs[1].tb_jmp_cache + 0x989) & 8) != 0 &&
       (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) != 0)) ||
      ((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x10) != 0)))) {
    uVar10 = uVar10 | 0x10;
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x1cd9) & 0x40) == 0) {
    cs[1].tb_jmp_cache[0x122] = local_60;
  }
  else {
    x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),(uint64_t)local_60
                       );
  }
  *(uint *)(cs[1].tb_jmp_cache + 0x388) = uVar10;
  cs->exception_index = 0xe;
switchD_0050e74c_caseD_1:
  if ((char)local_3c != '\0') {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
               ,0x2ad,"!probe");
  }
  raise_exception_err_ra_x86_64
            ((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),cs->exception_index,
             *(int *)(cs[1].tb_jmp_cache + 0x388),retaddr);
}

Assistant:

bool x86_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;

    env->retaddr = retaddr;
    if (handle_mmu_fault(cs, addr, size, access_type, mmu_idx)) {
        /* FIXME: On error in get_hphys we have already jumped out.  */
        g_assert(!probe);
        raise_exception_err_ra(env, cs->exception_index,
                               env->error_code, retaddr);
    }
    return true;
}